

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O2

void kca_inertial_acceleration(kca_joint *joint,ga_twist *xd,ga_acc_twist *xdd)

{
  frame *pfVar1;
  frame *pfVar2;
  uint __line;
  char *__assertion;
  
  if (joint == (kca_joint *)0x0) {
    __assertion = "joint";
    __line = 0x38;
  }
  else if (xd == (ga_twist *)0x0) {
    __assertion = "xd";
    __line = 0x39;
  }
  else if (xdd == (ga_acc_twist *)0x0) {
    __assertion = "xdd";
    __line = 0x3a;
  }
  else {
    pfVar1 = xd->frame;
    if (pfVar1 == (frame *)0x0) {
      __assertion = "xd->frame";
      __line = 0x3b;
    }
    else if (pfVar1->origin == (point *)0x0) {
      __assertion = "xd->frame->origin";
      __line = 0x3c;
    }
    else if (xd->point == pfVar1->origin) {
      if (xd->target_body == joint->target_body) {
        pfVar2 = joint->target_frame;
        if (pfVar1 == pfVar2) {
          xdd->target_body = joint->target_body;
          xdd->reference_body = joint->reference_body;
          xdd->frame = pfVar2;
          xdd->point = pfVar2->origin;
          return;
        }
        __assertion = "xd->frame == joint->target_frame";
        __line = 0x3f;
      }
      else {
        __assertion = "xd->target_body == joint->target_body";
        __line = 0x3e;
      }
    }
    else {
      __assertion = "xd->point == xd->frame->origin";
      __line = 0x3d;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,__line,
                "void kca_inertial_acceleration(const struct kca_joint *, const struct ga_twist *, struct ga_acc_twist *)"
               );
}

Assistant:

void kca_inertial_acceleration(
        const struct kca_joint *joint,
        const struct ga_twist *xd,
        struct ga_acc_twist *xdd)
{
    assert(joint);
    assert(xd);
    assert(xdd);
    assert(xd->frame);
    assert(xd->frame->origin);
    assert(xd->point == xd->frame->origin);         // screw twist
    assert(xd->target_body == joint->target_body);
    assert(xd->frame == joint->target_frame);

    xdd->target_body = joint->target_body;
    xdd->reference_body = joint->reference_body;
    xdd->frame = joint->target_frame;
    xdd->point = joint->target_frame->origin;
}